

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tes31TestPackage.cpp
# Opt level: O1

void __thiscall deqp::gles31::TestCaseWrapper::deinit(TestCaseWrapper *this,TestCase *testCase)

{
  Context *pCVar1;
  
  (*(testCase->super_TestNode)._vptr_TestNode[3])(testCase);
  pCVar1 = this->m_testPackage->m_context;
  glu::resetState(pCVar1->m_renderCtx,pCVar1->m_contextInfo);
  return;
}

Assistant:

void TestCaseWrapper::deinit (tcu::TestCase* testCase)
{
	testCase->deinit();

	DE_ASSERT(m_testPackage.getContext());
	glu::resetState(m_testPackage.getContext()->getRenderContext(), m_testPackage.getContext()->getContextInfo());
}